

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O3

void __thiscall
CMU462::DynamicScene::Joint::getAxes
          (Joint *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  pointer pVVar1;
  long lVar2;
  Vector3D *pVVar3;
  Matrix4x4 *pMVar4;
  Joint *pJVar5;
  byte bVar6;
  Matrix4x4 T;
  Matrix4x4 local_1b8;
  Vector3D local_130 [5];
  Matrix4x4 local_b0;
  
  bVar6 = 0;
  (*(this->super_SceneObject)._vptr_SceneObject[0xc])(&local_b0,this);
  pJVar5 = this->parent;
  if (pJVar5 != (Joint *)0x0) {
    do {
      (*(pJVar5->super_SceneObject)._vptr_SceneObject[0xc])(&local_1b8,pJVar5);
      Matrix4x4::operator*((Matrix4x4 *)local_130,&local_1b8,&local_b0);
      pVVar3 = local_130;
      pMVar4 = &local_b0;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        pMVar4->entries[0].x = ((Vector4D *)&pVVar3->x)->x;
        pVVar3 = (Vector3D *)((long)pVVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pJVar5 = pJVar5->parent;
    } while (pJVar5 != (Joint *)0x0);
  }
  (*(this->skeleton->mesh->super_SceneObject)._vptr_SceneObject[0xc])(&local_1b8);
  Matrix4x4::operator*((Matrix4x4 *)local_130,&local_1b8,&local_b0);
  pVVar3 = local_130;
  pMVar4 = &local_b0;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pMVar4->entries[0].x = ((Vector4D *)&pVVar3->x)->x;
    pVVar3 = (Vector3D *)((long)pVVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  local_1b8.entries[0].x = 1.0;
  local_1b8.entries[0].y = 0.0;
  local_1b8.entries[0].z = 0.0;
  Matrix4x4::operator*(local_130,&local_b0,(Vector3D *)&local_1b8);
  pVVar1 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1->z = local_130[0].z;
  pVVar1->x = local_130[0].x;
  pVVar1->y = local_130[0].y;
  local_1b8.entries[0].x = 0.0;
  local_1b8.entries[0].y = 1.0;
  local_1b8.entries[0].z = 0.0;
  Matrix4x4::operator*(local_130,&local_b0,(Vector3D *)&local_1b8);
  pVVar1 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1[1].z = local_130[0].z;
  pVVar1[1].x = local_130[0].x;
  pVVar1[1].y = local_130[0].y;
  local_1b8.entries[0].x = 0.0;
  local_1b8.entries[0].y = 0.0;
  local_1b8.entries[0].z = 1.0;
  Matrix4x4::operator*(local_130,&local_b0,(Vector3D *)&local_1b8);
  pVVar1 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1[2].z = local_130[0].z;
  pVVar1[2].x = local_130[0].x;
  pVVar1[2].y = local_130[0].y;
  return;
}

Assistant:

void Joint::getAxes(vector<Vector3D>& axes) {
  Matrix4x4 T = getRotation();
  for (Joint* j = parent; j != nullptr; j = j->parent) {
    T = j->getRotation() * T;
  }
  T = skeleton->mesh->getRotation() * T;
  axes.resize(3);
  axes[0] = T * Vector3D(1., 0., 0.);
  axes[1] = T * Vector3D(0., 1., 0.);
  axes[2] = T * Vector3D(0., 0., 1.);
}